

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

bool __thiscall
pybind11::detail::
copyable_holder_caster<kratos::asic::SinglePortSRAM,_std::shared_ptr<kratos::asic::SinglePortSRAM>,_void>
::load_value(copyable_holder_caster<kratos::asic::SinglePortSRAM,_std::shared_ptr<kratos::asic::SinglePortSRAM>,_void>
             *this,value_and_holder *v_h)

{
  void **ppvVar1;
  byte bVar2;
  runtime_error *this_00;
  long *plVar3;
  long *plVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  
  bVar2 = v_h->inst->field_0x30;
  if ((bVar2 & 2) == 0) {
    bVar2 = (v_h->inst->field_1).nonsimple.status[v_h->index] & 1;
  }
  else {
    bVar2 = bVar2 & 4;
  }
  if (bVar2 != 0) {
    ppvVar1 = v_h->vh;
    (this->super_type_caster_base<kratos::asic::SinglePortSRAM>).super_type_caster_generic.value =
         *ppvVar1;
    (this->holder).super___shared_ptr<kratos::asic::SinglePortSRAM,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)ppvVar1[1];
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->holder).
                super___shared_ptr<kratos::asic::SinglePortSRAM,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(ppvVar1 + 2));
    return true;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  type_id<std::shared_ptr<kratos::asic::SinglePortSRAM>>();
  std::operator+(&local_88,
                 "Unable to cast from non-held to held instance (T& to Holder<T>) of type \'",
                 &local_68);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_88);
  local_48 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_48 == plVar4) {
    local_38 = *plVar4;
    lStack_30 = plVar3[3];
    local_48 = &local_38;
  }
  else {
    local_38 = *plVar4;
  }
  local_40 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_48);
  *(undefined ***)this_00 = &PTR__runtime_error_004c7b68;
  __cxa_throw(this_00,&cast_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool load_value(value_and_holder &&v_h) {
        if (v_h.holder_constructed()) {
            value = v_h.value_ptr();
            holder = v_h.template holder<holder_type>();
            return true;
        }
        throw cast_error("Unable to cast from non-held to held instance (T& to Holder<T>) "
#if defined(NDEBUG)
                         "(compile in debug mode for type information)");
#else
                         "of type '"
                         + type_id<holder_type>() + "''");
#endif
    }